

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Ptr_t *
Acb_TransformPatchFunctions(Vec_Ptr_t *vSops,Vec_Wec_t *vSupps,Vec_Int_t **pvUsed,int nDivs)

{
  int iVar1;
  int i;
  int iVar2;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  char *__ptr;
  long lVar5;
  int iVar6;
  
  p = Vec_PtrAlloc(vSops->nSize);
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntStartFull(nDivs);
  p_02 = Vec_IntStart(nDivs);
  iVar6 = 0;
  do {
    iVar1 = vSupps->nSize;
    if (iVar1 <= iVar6) {
      for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
        pVVar3 = Vec_WecEntry(vSupps,iVar6);
        for (iVar1 = 0; iVar1 < pVVar3->nSize; iVar1 = iVar1 + 1) {
          i = Vec_IntEntry(pVVar3,iVar1);
          iVar2 = Vec_IntEntry(p_02,i);
          if (iVar2 != 0) {
            iVar2 = Vec_IntEntry(p_01,i);
            if (iVar2 < 0) {
              Vec_IntWriteEntry(p_01,i,p_00->nSize);
              Vec_IntPush(p_00,i);
            }
          }
        }
        iVar1 = vSupps->nSize;
      }
      for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
        pVVar3 = Vec_WecEntry(vSupps,iVar6);
        pcVar4 = (char *)Vec_PtrEntry(vSops,iVar6);
        pcVar4 = Acb_RemapOneFunction(pcVar4,pVVar3,p_01,p_00->nSize);
        Vec_PtrPush(p,pcVar4);
        iVar1 = vSupps->nSize;
      }
      Vec_IntFree(p_02);
      Vec_IntFree(p_01);
      *pvUsed = p_00;
      return p;
    }
    pVVar3 = Vec_WecEntry(vSupps,iVar6);
    pcVar4 = (char *)Vec_PtrEntry(vSops,iVar6);
    __ptr = Abc_UtilStrsav(pcVar4);
    pcVar4 = __ptr;
LAB_0032bf50:
    pcVar4 = strtok(pcVar4,"\n");
    if (pcVar4 != (char *)0x0) {
      lVar5 = 0;
      do {
        if (pcVar4[lVar5] != '-') {
          if (pcVar4[lVar5] == ' ') goto LAB_0032bf8e;
          iVar1 = Vec_IntEntry(pVVar3,(int)lVar5);
          Vec_IntWriteEntry(p_02,iVar1,1);
        }
        lVar5 = lVar5 + 1;
      } while( true );
    }
    free(__ptr);
    iVar6 = iVar6 + 1;
  } while( true );
LAB_0032bf8e:
  pcVar4 = (char *)0x0;
  goto LAB_0032bf50;
}

Assistant:

Vec_Ptr_t * Acb_TransformPatchFunctions( Vec_Ptr_t * vSops, Vec_Wec_t * vSupps, Vec_Int_t ** pvUsed, int nDivs )
{
    Vec_Ptr_t * vFuncs = Vec_PtrAlloc( Vec_PtrSize(vSops) );
    Vec_Int_t * vUsed = Vec_IntAlloc( 100 ); 
    Vec_Int_t * vMap = Vec_IntStartFull( nDivs );
    Vec_Int_t * vPres = Vec_IntStart( nDivs );
    Vec_Int_t * vLevel;
    int i, k, iVar;
    // check what divisors are used
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        char * pStrCopy = Abc_UtilStrsav( pSop );
        char * pToken = strtok( pStrCopy, "\n" ); 
        while ( pToken != NULL )
        {
            for ( k = 0; pToken[k] != ' '; k++ )
                if ( pToken[k] != '-' )
                    Vec_IntWriteEntry( vPres, Vec_IntEntry(vLevel, k), 1 );
            pToken = strtok( NULL, "\n" );
        }
        ABC_FREE( pStrCopy );
    }
    // create common order
    Vec_WecForEachLevel( vSupps, vLevel, i )
        Vec_IntForEachEntry( vLevel, iVar, k )
        {
            if ( !Vec_IntEntry(vPres, iVar) )
                continue;
            if ( Vec_IntEntry(vMap, iVar) >= 0 )
                continue;
            Vec_IntWriteEntry( vMap, iVar, Vec_IntSize(vUsed) );
            Vec_IntPush( vUsed, iVar );
        }
    //printf( "The number of used variables %d (out of %d).\n", Vec_IntSum(vPres), Vec_IntSize(vPres) );
    // remap SOPs
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        pSop = Acb_RemapOneFunction( pSop, vLevel, vMap, Vec_IntSize(vUsed) );
        //printf( "Function %d\n%s", i, pSop );
        Vec_PtrPush( vFuncs, pSop );
    }
    Vec_IntFree( vPres );
    Vec_IntFree( vMap );
    *pvUsed = vUsed;
    return vFuncs;
}